

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O2

bool __thiscall draco::CornerTable::ComputeVertexCorners(CornerTable *this,int num_vertices)

{
  bool bVar1;
  CornerIndex corner;
  long lVar2;
  undefined4 in_register_00000034;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  CornerIndex CVar6;
  FaceIndex face;
  reference rVar7;
  VertexIndex v;
  allocator_type local_a9;
  ulong local_a8;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *local_a0;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
  *local_98;
  ulong local_90;
  long local_88;
  vector<bool,_std::allocator<bool>_> visited_vertices;
  vector<bool,_std::allocator<bool>_> visited_corners;
  
  local_a8 = CONCAT44(in_register_00000034,num_vertices);
  this->num_original_vertices_ = num_vertices;
  local_a0 = &this->vertex_corners_;
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::resize(&local_a0->vector_,(long)num_vertices,(value_type *)&kInvalidCornerIndex);
  visited_corners.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited_vertices,(long)num_vertices,(bool *)&visited_corners,(allocator_type *)&v);
  v.value_ = v.value_ & 0xffffff00;
  face.value_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited_corners,
             (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),(bool *)&v,
             &local_a9);
  local_98 = &this->non_manifold_vertex_parents_;
  do {
    if ((uint)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->corner_to_vertex_map_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) / 3) <= face.value_) {
      this->num_isolated_vertices_ = 0;
      iVar3 = 0;
      uVar5 = 0;
      while ((uVar4 = (uint)uVar5,
             visited_vertices.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
             visited_vertices.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p ||
             (uVar4 != visited_vertices.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset))) {
        if ((*visited_vertices.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p >> (uVar5 & 0x3f) & 1)
            == 0) {
          iVar3 = iVar3 + 1;
          this->num_isolated_vertices_ = iVar3;
        }
        visited_vertices.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_start.super__Bit_iterator_base._M_p =
             visited_vertices.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar4 == 0x3f);
        uVar5 = (ulong)(uVar4 + 1);
        if (uVar4 == 0x3f) {
          uVar5 = 0;
        }
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&visited_corners.super__Bvector_base<std::allocator<bool>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&visited_vertices.super__Bvector_base<std::allocator<bool>_>);
      return true;
    }
    bVar1 = IsDegenerated(this,face);
    if (!bVar1) {
      local_90 = (ulong)(face.value_ * 3);
      lVar2 = 0;
      while (lVar2 != 3) {
        CVar6.value_ = (int)local_90 + (int)lVar2;
        local_88 = lVar2;
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&visited_corners,(ulong)CVar6.value_);
        if ((*rVar7._M_p & rVar7._M_mask) == 0) {
          v.value_ = (this->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[CVar6.value_].value_;
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&visited_vertices,(ulong)v.value_);
          uVar5 = rVar7._M_mask & *rVar7._M_p;
          if (uVar5 != 0) {
            std::
            vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ::push_back(&local_a0->vector_,(value_type *)&kInvalidCornerIndex);
            std::
            vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            ::push_back(&local_98->vector_,&v);
            std::vector<bool,_std::allocator<bool>_>::push_back(&visited_vertices,false);
            v.value_ = (uint)local_a8;
            local_a8 = (ulong)(v.value_ + 1);
          }
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&visited_vertices,(ulong)v.value_);
          *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
          corner.value_ = CVar6.value_;
          do {
            if (corner.value_ == 0xffffffff) goto LAB_0012ac24;
            rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              (&visited_corners,(ulong)corner.value_);
            *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
            (local_a0->vector_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[v.value_].value_ = corner.value_;
            if (uVar5 != 0) {
              (this->corner_to_vertex_map_).vector_.
              super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_ = v.value_;
            }
            corner = SwingLeft(this,corner);
          } while (corner.value_ != CVar6.value_);
          if (CVar6.value_ == 0xffffffff) {
LAB_0012ac24:
            for (CVar6 = SwingRight(this,CVar6); CVar6.value_ != 0xffffffff;
                CVar6 = SwingRight(this,CVar6)) {
              rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (&visited_corners,(ulong)CVar6.value_);
              *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
              if (uVar5 != 0) {
                (this->corner_to_vertex_map_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[CVar6.value_].value_ = v.value_;
              }
            }
          }
        }
        lVar2 = local_88 + 1;
      }
    }
    face.value_ = face.value_ + 1;
  } while( true );
}

Assistant:

bool CornerTable::ComputeVertexCorners(int num_vertices) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  num_original_vertices_ = num_vertices;
  vertex_corners_.resize(num_vertices, kInvalidCornerIndex);
  // Arrays for marking visited vertices and corners that allow us to detect
  // non-manifold vertices.
  std::vector<bool> visited_vertices(num_vertices, false);
  std::vector<bool> visited_corners(num_corners(), false);

  for (FaceIndex f(0); f < num_faces(); ++f) {
    const CornerIndex first_face_corner = FirstCorner(f);
    // Check whether the face is degenerated. If so ignore it.
    if (IsDegenerated(f)) {
      continue;
    }

    for (int k = 0; k < 3; ++k) {
      const CornerIndex c = first_face_corner + k;
      if (visited_corners[c.value()]) {
        continue;
      }
      VertexIndex v = corner_to_vertex_map_[c];
      // Note that one vertex maps to many corners, but we just keep track
      // of the vertex which has a boundary on the left if the vertex lies on
      // the boundary. This means that all the related corners can be accessed
      // by iterating over the SwingRight() operator.
      // In case of a vertex inside the mesh, the choice is arbitrary.
      bool is_non_manifold_vertex = false;
      if (visited_vertices[v.value()]) {
        // A visited vertex of an unvisited corner found. Must be a non-manifold
        // vertex.
        // Create a new vertex for it.
        vertex_corners_.push_back(kInvalidCornerIndex);
        non_manifold_vertex_parents_.push_back(v);
        visited_vertices.push_back(false);
        v = VertexIndex(num_vertices++);
        is_non_manifold_vertex = true;
      }
      // Mark the vertex as visited.
      visited_vertices[v.value()] = true;

      // First swing all the way to the left and mark all corners on the way.
      CornerIndex act_c(c);
      while (act_c != kInvalidCornerIndex) {
        visited_corners[act_c.value()] = true;
        // Vertex will eventually point to the left most corner.
        vertex_corners_[v] = act_c;
        if (is_non_manifold_vertex) {
          // Update vertex index in the corresponding face.
          corner_to_vertex_map_[act_c] = v;
        }
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          break;  // Full circle reached.
        }
      }
      if (act_c == kInvalidCornerIndex) {
        // If we have reached an open boundary we need to swing right from the
        // initial corner to mark all corners in the opposite direction.
        act_c = SwingRight(c);
        while (act_c != kInvalidCornerIndex) {
          visited_corners[act_c.value()] = true;
          if (is_non_manifold_vertex) {
            // Update vertex index in the corresponding face.
            corner_to_vertex_map_[act_c] = v;
          }
          act_c = SwingRight(act_c);
        }
      }
    }
  }

  // Count the number of isolated (unprocessed) vertices.
  num_isolated_vertices_ = 0;
  for (bool visited : visited_vertices) {
    if (!visited) {
      ++num_isolated_vertices_;
    }
  }
  return true;
}